

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O2

bool __thiscall acto::actor_ref::send<msg_loop>(actor_ref *this,msg_loop *msg)

{
  bool bVar1;
  _Head_base<0UL,_acto::core::msg_t_*,_false> local_20;
  msg_t *local_18;
  
  if (this->object_ == (object_t *)0x0) {
    bVar1 = false;
  }
  else {
    std::make_unique<acto::core::msg_wrap_t<msg_loop>,msg_loop>((msg_loop *)&local_18);
    local_20._M_head_impl = local_18;
    local_18 = (msg_t *)0x0;
    bVar1 = send_message(this,(unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>
                               *)&local_20);
    if (local_20._M_head_impl != (msg_t *)0x0) {
      (*(local_20._M_head_impl)->_vptr_msg_t[1])();
    }
    local_20._M_head_impl = (msg_t *)0x0;
    if (local_18 != (msg_t *)0x0) {
      (**(code **)(*(long *)local_18 + 8))();
    }
  }
  return bVar1;
}

Assistant:

inline bool send(Msg&& msg) const {
    if (!object_) {
      return false;
    }

    return send_message(
      std::make_unique<core::msg_wrap_t<std::remove_cvref_t<Msg>>>(
        std::forward<Msg>(msg)));
  }